

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O3

void PatchRandoWorldEdits::put_back_golems_in_lake_shrine_keydoor_map(World *world)

{
  mapped_type pMVar1;
  pointer pGVar2;
  pointer ppEVar3;
  mapped_type *ppMVar4;
  EntityMaskFlag local_10;
  
  local_10.super_Flag._vptr_Flag =
       (_func_int **)CONCAT62(local_10.super_Flag._vptr_Flag._2_6_,0x132);
  ppMVar4 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&world->_maps,(key_type *)&local_10);
  pMVar1 = *ppMVar4;
  pGVar2 = (pMVar1->_global_entity_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pMVar1->_global_entity_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar2) {
    (pMVar1->_global_entity_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar2;
  }
  pGVar2 = (pMVar1->_key_door_mask_flags).
           super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pMVar1->_key_door_mask_flags).
      super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_finish != pGVar2) {
    (pMVar1->_key_door_mask_flags).
    super__Vector_base<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>._M_impl.
    super__Vector_impl_data._M_finish = pGVar2;
  }
  ppEVar3 = (pMVar1->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (4 < (ulong)((long)(pMVar1->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3)) {
    local_10.super_Flag.byte = 7;
    local_10.super_Flag.bit = '\x05';
    local_10.super_Flag._11_1_ = 0;
    local_10.super_Flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262e58;
    std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
              (&(ppEVar3[4]->_attrs).mask_flags,&local_10);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",4);
}

Assistant:

static void put_back_golems_in_lake_shrine_keydoor_map(World& world)
    {
        Map* map = world.map(MAP_LAKE_SHRINE_0F_KEYDOOR);
        map->global_entity_mask_flags().clear();
        map->key_door_mask_flags().clear();
        map->entity(4)->mask_flags().emplace_back(EntityMaskFlag(false, 7, 5));
    }